

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::getAttributeData
          (LineRenderCase *this,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *data)

{
  uint uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  pointer pVVar14;
  float fVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  float fVar19;
  undefined4 uVar20;
  undefined4 in_XMM5_Db;
  undefined1 in_XMM6 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  vector<int,_std::allocator<int>_> cellOrder;
  Random rnd;
  _Vector_base<int,_std::allocator<int>_> local_38;
  deRandom local_20;
  undefined1 auVar18 [16];
  undefined1 auVar25 [16];
  
  iVar6 = *(int *)&(this->super_BBoxRenderCase).field_0xd4;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_38,(long)(iVar6 * iVar6 * 2),
             (allocator_type *)&local_20);
  deRandom_init(&local_20,0xde12345);
  uVar8 = (ulong)((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_38._M_impl.super__Vector_impl_data._M_start) >> 2;
  uVar10 = 0;
  uVar9 = uVar8 & 0xffffffff;
  if ((int)uVar8 < 1) {
    uVar9 = uVar10;
  }
  for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    local_38._M_impl.super__Vector_impl_data._M_start[uVar10] = (int)uVar10;
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)&local_20,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_38._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_38._M_impl.super__Vector_impl_data._M_finish);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (data,(long)local_38._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_38._M_impl.super__Vector_impl_data._M_start);
  lVar11 = 0;
  for (lVar13 = 0;
      lVar13 < (int)((ulong)((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_38._M_impl.super__Vector_impl_data._M_start) >> 2);
      lVar13 = lVar13 + 1) {
    uVar1 = *(uint *)((long)local_38._M_impl.super__Vector_impl_data._M_start + lVar11);
    iVar6 = *(int *)&(this->super_BBoxRenderCase).field_0xd4;
    lVar2 = CONCAT44((int)uVar1 >> 0x1f,(int)uVar1 >> 1);
    iVar7 = (int)lVar11;
    pVVar14 = (data->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start + iVar7;
    fVar19 = (float)iVar6;
    iVar12 = (int)(lVar2 % (long)iVar6);
    iVar6 = (int)(lVar2 / (long)iVar6);
    if ((uVar1 & 1) == 0) {
      auVar17._0_4_ = (float)(iVar6 + 1);
      auVar17._4_4_ = (float)iVar12;
      auVar17._8_8_ = 0;
      auVar21._0_4_ = (float)iVar6;
      auVar21._4_4_ = auVar17._4_4_;
      auVar21._8_8_ = 0;
      auVar3._4_4_ = fVar19;
      auVar3._0_4_ = fVar19;
      auVar3._8_4_ = in_XMM5_Db;
      auVar3._12_4_ = in_XMM5_Db;
      auVar22 = divps(auVar21,auVar3);
      auVar23._0_8_ = auVar22._0_8_;
      auVar23._8_8_ = 0x3f80000000000000;
      *(undefined1 (*) [16])pVVar14->m_data = auVar23;
      pVVar14 = (data->
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
                _M_impl.super__Vector_impl_data._M_start + (iVar7 + 1);
      pVVar14->m_data[0] = 0.0;
      pVVar14->m_data[1] = 0.0;
      pVVar14->m_data[2] = 1.0;
      pVVar14->m_data[3] = 1.0;
      fVar19 = (float)*(int *)&(this->super_BBoxRenderCase).field_0xd4;
      auVar4._4_4_ = fVar19;
      auVar4._0_4_ = fVar19;
      auVar4._8_4_ = fVar19;
      auVar4._12_4_ = fVar19;
      auVar22 = divps(auVar17,auVar4);
      uVar16 = auVar22._0_8_;
      uVar20 = 0;
      in_XMM5_Db = 0x3f800000;
    }
    else {
      auVar23._4_12_ = in_XMM6._4_12_;
      auVar23._0_4_ = (float)iVar6;
      fVar15 = (float)iVar12;
      auVar18._0_8_ = CONCAT44((float)(iVar6 + 1),fVar15);
      auVar18._8_8_ = 0;
      auVar25._8_4_ = (float)(iVar6 + 1);
      auVar25._0_8_ = auVar18._0_8_;
      auVar25._12_4_ = in_XMM6._4_4_;
      auVar24._8_8_ = auVar25._8_8_;
      auVar24._4_4_ = auVar23._0_4_;
      auVar24._0_4_ = fVar15;
      auVar22._4_4_ = fVar19;
      auVar22._0_4_ = fVar19;
      auVar22._8_4_ = in_XMM5_Db;
      auVar22._12_4_ = in_XMM5_Db;
      auVar22 = divps(auVar24,auVar22);
      *(long *)pVVar14->m_data = auVar22._0_8_;
      pVVar14->m_data[2] = 0.0;
      pVVar14->m_data[3] = 1.0;
      pVVar14 = (data->
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
                _M_impl.super__Vector_impl_data._M_start + (iVar7 + 1);
      pVVar14->m_data[0] = 0.0;
      pVVar14->m_data[1] = 1.0;
      pVVar14->m_data[2] = 0.0;
      pVVar14->m_data[3] = 1.0;
      fVar19 = (float)*(int *)&(this->super_BBoxRenderCase).field_0xd4;
      auVar5._4_4_ = fVar19;
      auVar5._0_4_ = fVar19;
      auVar5._8_4_ = fVar19;
      auVar5._12_4_ = fVar19;
      auVar22 = divps(auVar18,auVar5);
      uVar16 = auVar22._0_8_;
      uVar20 = 0x3f800000;
      in_XMM5_Db = 0;
    }
    pVVar14 = (data->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start + (iVar7 + 2);
    *(undefined8 *)pVVar14->m_data = uVar16;
    pVVar14->m_data[2] = 0.0;
    pVVar14->m_data[3] = 1.0;
    iVar7 = iVar7 + 3;
    pVVar14 = (data->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar14[iVar7].m_data[0] = 0.0;
    *(ulong *)(pVVar14[iVar7].m_data + 1) = CONCAT44(in_XMM5_Db,uVar20);
    pVVar14[iVar7].m_data[3] = 1.0;
    lVar11 = lVar11 + 4;
    in_XMM6 = auVar23;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void LineRenderCase::getAttributeData (std::vector<tcu::Vec4>& data) const
{
	const tcu::Vec4		green		(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4		blue		(0.0f, 0.0f, 1.0f, 1.0f);
	std::vector<int>	cellOrder	(m_patternSide * m_patternSide * 2);
	de::Random			rnd			(0xDE12345);

	// generate crosshatch pattern with segments in random order
	for (int ndx = 0; ndx < (int)cellOrder.size(); ++ndx)
		cellOrder[ndx] = ndx;
	rnd.shuffle(cellOrder.begin(), cellOrder.end());

	data.resize(cellOrder.size() * 4);
	for (int ndx = 0; ndx < (int)cellOrder.size(); ++ndx)
	{
		const int segmentID		= cellOrder[ndx];
		const int direction		= segmentID & 0x01;
		const int majorCoord	= (segmentID >> 1) / m_patternSide;
		const int minorCoord	= (segmentID >> 1) % m_patternSide;

		if (direction)
		{
			data[(ndx * 2 + 0) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(minorCoord) / float(m_patternSide), float(majorCoord) / float(m_patternSide), 0.0f, 1.0f);
			data[(ndx * 2 + 0) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = green;
			data[(ndx * 2 + 1) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(minorCoord) / float(m_patternSide), float(majorCoord + 1) / float(m_patternSide), 0.0f, 1.0f);
			data[(ndx * 2 + 1) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = green;
		}
		else
		{
			data[(ndx * 2 + 0) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(majorCoord) / float(m_patternSide), float(minorCoord) / float(m_patternSide), 0.0f, 1.0f);
			data[(ndx * 2 + 0) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = blue;
			data[(ndx * 2 + 1) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(majorCoord + 1) / float(m_patternSide), float(minorCoord) / float(m_patternSide), 0.0f, 1.0f);
			data[(ndx * 2 + 1) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = blue;
		}
	}
}